

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtree.cpp
# Opt level: O1

bool __thiscall DTreeParenthoodPropagator::propagateRemEdge(DTreeParenthoodPropagator *this,int e)

{
  Tint *pTVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint *puVar5;
  IntVar *pIVar6;
  int *piVar7;
  undefined4 uVar8;
  bool bVar9;
  ulong uVar10;
  int iVar11;
  long lVar12;
  size_t __size;
  int *pt;
  ulong uVar13;
  Clause *pCVar14;
  vec<Lit> ps;
  Clause *c;
  undefined1 local_48 [8];
  undefined8 uStack_40;
  Clause *local_38;
  
  bVar9 = DReachabilityPropagator::propagateRemEdge((DReachabilityPropagator *)this,e);
  if (bVar9) {
    puVar5 = *(uint **)&(this->super_DTreePropagator).super_DReachabilityPropagator.
                        super_GraphPropagator.endnodes.
                        super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[e].
                        super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data;
    uVar2 = *puVar5;
    uVar3 = puVar5[1];
    pIVar6 = (this->parents).data[uVar3];
    if (((pIVar6->min).v <= (int)uVar2) && ((int)uVar2 <= (pIVar6->max).v)) {
      if (pIVar6->vals == (Tchar *)0x0) {
        if (uVar3 == uVar2) {
          return bVar9;
        }
      }
      else {
        if (uVar3 == uVar2) {
          return bVar9;
        }
        if (pIVar6->vals[(int)uVar2].v == '\0') {
          return bVar9;
        }
      }
      if (so.lazy == true) {
        local_48 = (undefined1  [8])0x0;
        uStack_40 = (Lit *)0x0;
        vec<Lit>::push((vec<Lit> *)local_48);
        uVar2 = (this->super_DTreePropagator).super_DReachabilityPropagator.super_GraphPropagator.es
                .data[(uint)e].v;
        local_38 = (Clause *)
                   CONCAT44(local_38._4_4_,
                            (uint)((int)sat.assigns.data[uVar2] - 1U < 0xfffffffd) + uVar2 * 2);
        vec<Lit>::push((vec<Lit> *)local_48,(Lit *)&local_38);
        uVar8 = local_48._0_4_;
        uVar13 = (ulong)local_48 & 0xffffffff;
        __size = 8;
        if (local_48._0_4_ != 0) {
          __size = (ulong)(local_48._0_4_ - 1) * 4 + 8;
        }
        local_38 = (Clause *)malloc(__size);
        uVar2 = *(uint *)local_38;
        local_38->data[0].x = -2;
        *(uint *)local_38 = uVar2 & 0xfc | uVar8 << 8;
        if (uVar8 != 0) {
          uVar10 = 0;
          do {
            local_38->data[uVar10].x = uStack_40[uVar10].x;
            uVar10 = uVar10 + 1;
          } while (uVar13 != uVar10);
        }
        *(byte *)local_38 = *(byte *)local_38 | 2;
        vec<Clause_*>::push(sat.rtrail.data + (sat.rtrail.sz - 1),&local_38);
        pCVar14 = local_38;
        if (uStack_40 != (Lit *)0x0) {
          free(uStack_40);
        }
      }
      else {
        pCVar14 = (Clause *)0x0;
      }
      piVar7 = (this->super_DTreePropagator).super_DReachabilityPropagator.super_GraphPropagator.
               endnodes.
               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[e].
               super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_start;
      pIVar6 = (this->parents).data[(uint)piVar7[1]];
      iVar11 = 1;
      (*(pIVar6->super_Var).super_Branching._vptr_Branching[0x11])(pIVar6,(long)*piVar7,pCVar14,1);
      uVar2 = *(uint *)(*(long *)&(this->super_DTreePropagator).super_DReachabilityPropagator.
                                  super_GraphPropagator.endnodes.
                                  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start[e].
                                  super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data + 4);
      pIVar6 = (this->parents).data[uVar2];
      uVar3 = (pIVar6->min).v;
      uVar4 = (pIVar6->max).v;
      if (uVar3 != uVar4) {
        iVar11 = 2;
        if ((int)((long)(int)uVar3 + 1) < (int)uVar4) {
          lVar12 = 0;
          do {
            iVar11 = iVar11 + pIVar6->vals[lVar12 + (long)(int)uVar3 + 1].v;
            lVar12 = lVar12 + 1;
          } while (~uVar3 + uVar4 != (int)lVar12);
        }
      }
      pTVar1 = this->dom_size + (int)uVar2;
      uStack_40 = (Lit *)CONCAT44(4,pTVar1->v);
      local_48 = (undefined1  [8])pTVar1;
      vec<TrailElem>::push(&engine.trail,(TrailElem *)local_48);
      pTVar1->v = iVar11;
    }
  }
  return bVar9;
}

Assistant:

bool DTreeParenthoodPropagator::propagateRemEdge(int e) {
	assert(getEdgeVar(e).isFixed());
	assert(getEdgeVar(e).isFalse());

	if (!DTreePropagator::propagateRemEdge(e)) {
		return false;
	}

	// If tail of e is the only possible parent of head of e
	// fail (unless head of e is the root)
	// Otherwise remove that value and that's it.
	if (parents[getHead(e)]->indomain(getTail(e))) {
		if (getHead(e) == getTail(e)) {
			return true;
		}
		Clause* r = nullptr;
		if (so.lazy) {
			vec<Lit> ps;
			ps.push();
			ps.push(getEdgeVar(e).getValLit());
			r = Reason_new(ps);
		}
		parents[getHead(e)]->remVal(getTail(e), r);
		if (DEBUG) {
			std::cout << "This guy " << getHead(e) << " cannot have " << getTail(e)
								<< " as a parent, because I removed edge" << e << '\n';
		}
		assert(parents[getHead(e)]->size() > 0);
		dom_size[getHead(e)] = parents[getHead(e)]->size();
	}

	return true;
}